

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::CopyFrom(Message *this,Message *from)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  Descriptor *descriptor;
  LogMessage *in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff60;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  pDVar1 = GetDescriptor((Message *)in_stack_ffffffffffffff50);
  pDVar2 = GetDescriptor((Message *)in_stack_ffffffffffffff50);
  if (pDVar2 != pDVar1) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff60,level,(char *)in_stack_ffffffffffffff50,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    Descriptor::full_name_abi_cxx11_(pDVar1);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    pDVar1 = GetDescriptor((Message *)in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff50 = (LogMessage *)Descriptor::full_name_abi_cxx11_(pDVar1);
    in_stack_ffffffffffffff48 =
         internal::LogMessage::operator<<
                   (in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    internal::LogMessage::~LogMessage((LogMessage *)0x425ddb);
  }
  internal::ReflectionOps::Copy
            ((Message *)in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
  return;
}

Assistant:

void Message::CopyFrom(const Message& from) {
  const Descriptor* descriptor = GetDescriptor();
  GOOGLE_CHECK_EQ(from.GetDescriptor(), descriptor)
      << ": Tried to copy from a message with a different type. "
         "to: "
      << descriptor->full_name()
      << ", "
         "from: "
      << from.GetDescriptor()->full_name();
  ReflectionOps::Copy(from, this);
}